

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xwinman.c
# Opt level: O3

void Set_BitGravity(XButtonEvent *event,DspInterface dsp,Window window,int grav)

{
  uint uVar1;
  undefined8 uVar2;
  
  uVar1 = dsp->BitGravity - 1;
  if ((uVar1 < 9) && ((0x145U >> (uVar1 & 0x1f) & 1) != 0)) {
    uVar2 = *(undefined8 *)
             ((long)&(dsp->device).active + *(long *)(&DAT_0014a078 + (ulong)uVar1 * 8));
  }
  else {
    uVar2 = 0;
  }
  dsp->BitGravity = grav;
  XSetWindowBackgroundPixmap(event->display,uVar2,dsp->GravityOffPixmap);
  XClearWindow(event->display,uVar2);
  XSetWindowBackgroundPixmap(event->display,window,dsp->GravityOnPixmap);
  XClearWindow(event->display,window);
  return;
}

Assistant:

void Set_BitGravity(XButtonEvent *event, DspInterface dsp, Window window, int grav)
{
  Window OldWindow = 0;

  /* Change Background Pixmap of Gravity Window */
  XLOCK;
  switch (dsp->BitGravity) {
    case NorthWestGravity: OldWindow = dsp->NWGrav; break;
    case NorthEastGravity: OldWindow = dsp->NEGrav; break;
    case SouthWestGravity: OldWindow = dsp->SWGrav; break;
    case SouthEastGravity: OldWindow = dsp->SEGrav; break;
  }

  dsp->BitGravity = grav;

  XSetWindowBackgroundPixmap(event->display, OldWindow, dsp->GravityOffPixmap);
  XClearWindow(event->display, OldWindow);

  XSetWindowBackgroundPixmap(event->display, window, dsp->GravityOnPixmap);
  XClearWindow(event->display, window);
  XUNLOCK(dsp);
}